

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O0

void __thiscall
glcts::ArraysOfArrays::ExpressionsLength1<glcts::ArraysOfArrays::Interface::ES>::
test_shader_compilation
          (ExpressionsLength1<glcts::ArraysOfArrays::Interface::ES> *this,
          TestShaderType tested_shader_type)

{
  string *tested_snippet;
  string *local_170;
  string *test_snippet;
  size_t case_specific_string_index;
  bool test_compute;
  string *psStack_e0;
  string local_d8 [8];
  string case_specific_string [4];
  allocator<char> local_39;
  undefined1 local_38 [8];
  string array_declaration;
  TestShaderType tested_shader_type_local;
  ExpressionsLength1<glcts::ArraysOfArrays::Interface::ES> *this_local;
  
  array_declaration.field_2._12_4_ = tested_shader_type;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_38,"    int x[4][3][2][1];\n\n",&local_39);
  std::allocator<char>::~allocator(&local_39);
  case_specific_string_index._3_1_ = 1;
  psStack_e0 = local_d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_d8,"    if (x.length() != 4) {\n        result = 0.0f;\n    }\n",
             (allocator<char> *)((long)&case_specific_string_index + 7));
  psStack_e0 = (string *)(case_specific_string[0].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(case_specific_string[0].field_2._M_local_buf + 8),
             "    if (x[0].length() != 3) {\n        result = 0.0f;\n    }\n",
             (allocator<char> *)((long)&case_specific_string_index + 6));
  psStack_e0 = (string *)(case_specific_string[1].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(case_specific_string[1].field_2._M_local_buf + 8),
             "    if (x[0][0].length() != 2) {\n        result = 0.0f;\n    }\n",
             (allocator<char> *)((long)&case_specific_string_index + 5));
  psStack_e0 = (string *)(case_specific_string[2].field_2._M_local_buf + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(case_specific_string[2].field_2._M_local_buf + 8),
             "    if (x[0][0][0].length() != 1) {\n        result = 0.0f;\n    }\n",
             (allocator<char> *)((long)&case_specific_string_index + 4));
  case_specific_string_index._3_1_ = 0;
  std::allocator<char>::~allocator((allocator<char> *)((long)&case_specific_string_index + 4));
  std::allocator<char>::~allocator((allocator<char> *)((long)&case_specific_string_index + 5));
  std::allocator<char>::~allocator((allocator<char> *)((long)&case_specific_string_index + 6));
  std::allocator<char>::~allocator((allocator<char> *)((long)&case_specific_string_index + 7));
  case_specific_string_index._2_1_ = array_declaration.field_2._12_4_ == 2;
  for (test_snippet = (string *)0x0; test_snippet < (string *)&DAT_00000004;
      test_snippet = (string *)&test_snippet->field_0x1) {
    tested_snippet =
         (string *)
         ((long)&case_specific_string[(long)&test_snippet[-1].field_2._M_allocated_capacity + 0xf].
                 field_2 + 8);
    if ((case_specific_string_index._2_1_ & 1) == 0) {
      execute_draw_test(this,array_declaration.field_2._12_4_,(string *)local_38,tested_snippet);
    }
    else {
      execute_dispatch_test(this,array_declaration.field_2._12_4_,(string *)local_38,tested_snippet)
      ;
    }
    (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>).super_TestCase.super_TestNode
      ._vptr_TestNode[5])();
  }
  local_170 = (string *)(case_specific_string[3].field_2._M_local_buf + 8);
  do {
    local_170 = local_170 + -0x20;
    std::__cxx11::string::~string(local_170);
  } while (local_170 != local_d8);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void ExpressionsLength1<API>::test_shader_compilation(typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	std::string array_declaration	  = "    int x[4][3][2][1];\n\n";
	std::string case_specific_string[] = { "    if (x.length() != 4) {\n"
										   "        result = 0.0f;\n    }\n",
										   "    if (x[0].length() != 3) {\n"
										   "        result = 0.0f;\n    }\n",
										   "    if (x[0][0].length() != 2) {\n"
										   "        result = 0.0f;\n    }\n",
										   "    if (x[0][0][0].length() != 1) {\n"
										   "        result = 0.0f;\n    }\n" };
	const bool test_compute = (TestCaseBase<API>::COMPUTE_SHADER_TYPE == tested_shader_type);

	for (size_t case_specific_string_index = 0;
		 case_specific_string_index < sizeof(case_specific_string) / sizeof(case_specific_string[0]);
		 case_specific_string_index++)
	{
		const std::string& test_snippet = case_specific_string[case_specific_string_index];

		if (false == test_compute)
		{
			execute_draw_test(tested_shader_type, array_declaration, test_snippet);
		}
		else
		{
			execute_dispatch_test(tested_shader_type, array_declaration, test_snippet);
		}

		/* Deallocate any resources used. */
		this->delete_objects();
	} /* for (int case_specific_string_index = 0; ...) */
}